

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

int Sim_ComputeSuppRoundNode(Sim_Man_t *p,int iNumCi,int fUseTargets)

{
  void *pvVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Abc_Obj_t *pAVar8;
  Vec_Vec_t *p_00;
  abctime aVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pAVar11;
  Sim_Pat_t *Entry;
  abctime clk;
  int local_68;
  int fFirst;
  int Counter;
  int fType1;
  int fType0;
  int LuckyPat;
  int Output;
  int v;
  int k;
  int i;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNodeCi;
  Vec_Vec_t *vNodesByLevel;
  Vec_Ptr_t *vTargets;
  Sim_Pat_t *pPat;
  int fVerbose;
  int fUseTargets_local;
  int iNumCi_local;
  Sim_Man_t *p_local;
  
  local_68 = 0;
  bVar3 = true;
  aVar7 = Abc_Clock();
  pAVar8 = Abc_NtkCi(p->pNtk,iNumCi);
  p_00 = Abc_DfsLevelized(pAVar8,0);
  aVar9 = Abc_Clock();
  p->timeTrav = (aVar9 - aVar7) + p->timeTrav;
  Sim_UtilInfoFlip(p,pAVar8);
  for (v = 0; iVar4 = Vec_VecSize(p_00), v < iVar4; v = v + 1) {
    Output = 0;
    while( true ) {
      pVVar10 = Vec_VecEntry(p_00,v);
      iVar4 = Vec_PtrSize(pVVar10);
      if (iVar4 <= Output) break;
      pVVar10 = Vec_VecEntry(p_00,v);
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pVVar10,Output);
      pAVar11 = Abc_ObjFanin0(pAVar8);
      iVar4 = Abc_NodeIsTravIdCurrent(pAVar11);
      pAVar11 = Abc_ObjFanin1(pAVar8);
      iVar5 = Abc_NodeIsTravIdCurrent(pAVar11);
      aVar7 = Abc_Clock();
      Sim_UtilSimulateNode(p,pAVar8,1,iVar4,iVar5);
      aVar9 = Abc_Clock();
      p->timeSim = (aVar9 - aVar7) + p->timeSim;
      Output = Output + 1;
    }
  }
  iVar4 = iNumCi >> 5;
  bVar2 = (byte)iNumCi;
  if (fUseTargets == 0) {
    for (fType0 = 0; iVar5 = Abc_NtkCoNum(p->pNtk), fType0 < iVar5; fType0 = fType0 + 1) {
      pAVar8 = Abc_NtkCo(p->pNtk,fType0);
      iVar5 = Abc_NodeIsTravIdCurrent(pAVar8);
      if (iVar5 != 0) {
        pAVar8 = Abc_ObjFanin0(pAVar8);
        iVar5 = Sim_UtilInfoCompare(p,pAVar8);
        if ((iVar5 == 0) &&
           ((*(uint *)((long)p->vSuppFun->pArray[fType0] + (long)iVar4 * 4) & 1 << (bVar2 & 0x1f))
            == 0)) {
          local_68 = local_68 + 1;
          pvVar1 = p->vSuppFun->pArray[fType0];
          *(uint *)((long)pvVar1 + (long)iVar4 * 4) =
               1 << (bVar2 & 0x1f) | *(uint *)((long)pvVar1 + (long)iVar4 * 4);
        }
      }
    }
  }
  else {
    pVVar10 = (Vec_Ptr_t *)p->vSuppTargs->pArray[iNumCi];
    v = pVVar10->nSize;
    while (v = v + -1, -1 < v) {
      iVar5 = (int)pVVar10->pArray[v];
      pAVar8 = Abc_NtkCo(p->pNtk,iVar5);
      pAVar8 = Abc_ObjFanin0(pAVar8);
      iVar6 = Abc_NodeIsTravIdCurrent(pAVar8);
      if (iVar6 == 0) {
        __assert_fail("Abc_NodeIsTravIdCurrent(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSupp.c"
                      ,0xf3,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
      }
      iVar6 = Sim_UtilInfoCompare(p,pAVar8);
      if (iVar6 == 0) {
        Vec_PtrRemove(pVVar10,pVVar10->pArray[v]);
        local_68 = local_68 + 1;
        if ((*(uint *)((long)p->vSuppFun->pArray[iVar5] + (long)iVar4 * 4) & 1 << (bVar2 & 0x1f)) !=
            0) {
          __assert_fail("!Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simSupp.c"
                        ,0xff,"int Sim_ComputeSuppRoundNode(Sim_Man_t *, int, int)");
        }
        pvVar1 = p->vSuppFun->pArray[iVar5];
        *(uint *)((long)pvVar1 + (long)iVar4 * 4) =
             1 << (bVar2 & 0x1f) | *(uint *)((long)pvVar1 + (long)iVar4 * 4);
        Sim_UtilInfoDetectDiffs
                  ((uint *)p->vSim0->pArray[pAVar8->Id],(uint *)p->vSim1->pArray[pAVar8->Id],
                   p->nSimWords,p->vDiffs);
        if (((bVar3) || (p->vFifo->nSize < 0x3e9)) && (iVar6 = Vec_IntSize(p->vDiffs), 0 < iVar6)) {
          iVar6 = Vec_IntEntry(p->vDiffs,0);
          Entry = Sim_ManPatAlloc(p);
          Entry->Input = iNumCi;
          Entry->Output = iVar5;
          for (LuckyPat = 0; iVar5 = Abc_NtkCiNum(p->pNtk), LuckyPat < iVar5;
              LuckyPat = LuckyPat + 1) {
            pAVar8 = Abc_NtkCi(p->pNtk,LuckyPat);
            if ((*(uint *)((long)p->vSim0->pArray[pAVar8->Id] + (long)(iVar6 >> 5) * 4) &
                1 << ((byte)iVar6 & 0x1f)) != 0) {
              Entry->pData[LuckyPat >> 5] =
                   1 << ((byte)LuckyPat & 0x1f) | Entry->pData[LuckyPat >> 5];
            }
          }
          Vec_PtrPush(p->vFifo,Entry);
          bVar3 = false;
        }
      }
    }
  }
  Vec_VecFree(p_00);
  return local_68;
}

Assistant:

int Sim_ComputeSuppRoundNode( Sim_Man_t * p, int iNumCi, int  fUseTargets )
{
    int fVerbose = 0;
    Sim_Pat_t * pPat;
    Vec_Ptr_t * vTargets;
    Vec_Vec_t * vNodesByLevel;
    Abc_Obj_t * pNodeCi, * pNode;
    int i, k, v, Output, LuckyPat, fType0, fType1;
    int Counter = 0;
    int fFirst = 1;
    abctime clk;
    // collect nodes by level in the TFO of the CI 
    // this procedure does not collect the CIs and COs
    // but it increments TravId of the collected nodes and CIs/COs
clk = Abc_Clock();
    pNodeCi       = Abc_NtkCi( p->pNtk, iNumCi );
    vNodesByLevel = Abc_DfsLevelized( pNodeCi, 0 );
p->timeTrav += Abc_Clock() - clk;
    // complement the simulation info of the selected CI
    Sim_UtilInfoFlip( p, pNodeCi );
    // simulate the levelized structure of nodes
    Vec_VecForEachEntry( Abc_Obj_t *, vNodesByLevel, pNode, i, k )
    {
        fType0 = Abc_NodeIsTravIdCurrent( Abc_ObjFanin0(pNode) );
        fType1 = Abc_NodeIsTravIdCurrent( Abc_ObjFanin1(pNode) );
clk = Abc_Clock();
        Sim_UtilSimulateNode( p, pNode, 1, fType0, fType1 );
p->timeSim += Abc_Clock() - clk;
    }
    // set the simulation info of the affected COs
    if ( fUseTargets )
    {
        vTargets = (Vec_Ptr_t *)p->vSuppTargs->pArray[iNumCi];
        for ( i = vTargets->nSize - 1; i >= 0; i-- )
        {
            // get the target output
            Output = (int)(ABC_PTRUINT_T)vTargets->pArray[i];
            // get the target node
            pNode  = Abc_ObjFanin0( Abc_NtkCo(p->pNtk, Output) );
            // the output should be in the cone
            assert( Abc_NodeIsTravIdCurrent(pNode) );

            // skip if the simulation info is equal
            if ( Sim_UtilInfoCompare( p, pNode ) )
                continue;

            // otherwise, we solved a new target
            Vec_PtrRemove( vTargets, vTargets->pArray[i] );
if ( fVerbose )
    printf( "(%d,%d) ", iNumCi, Output );
            Counter++;
            // make sure this variable is not yet detected
            assert( !Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi) );
            // set this variable
            Sim_SuppFunSetVar( p->vSuppFun, Output, iNumCi );
            
            // detect the differences in the simulation info
            Sim_UtilInfoDetectDiffs( (unsigned *)p->vSim0->pArray[pNode->Id], (unsigned *)p->vSim1->pArray[pNode->Id], p->nSimWords, p->vDiffs );
            // create new patterns
            if ( !fFirst && p->vFifo->nSize > 1000 )
                continue;

            Vec_IntForEachEntry( p->vDiffs, LuckyPat, k )
            {
                // set the new pattern
                pPat = Sim_ManPatAlloc( p );
                pPat->Input  = iNumCi;
                pPat->Output = Output;
                Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                    if ( Sim_SimInfoHasVar( p->vSim0, pNodeCi, LuckyPat ) )
                        Sim_SetBit( pPat->pData, v );
                Vec_PtrPush( p->vFifo, pPat );

                fFirst = 0;
                break;
            }
        }
if ( fVerbose && Counter )
printf( "\n" );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pNode, Output )
        {
            if ( !Abc_NodeIsTravIdCurrent( pNode ) )
                continue;
            if ( !Sim_UtilInfoCompare( p, Abc_ObjFanin0(pNode) ) )
            {
                if ( !Sim_SuppFunHasVar(p->vSuppFun, Output, iNumCi) )
                {
                    Counter++;
                    Sim_SuppFunSetVar( p->vSuppFun, Output, iNumCi );
                }
            }
        }
    }
    Vec_VecFree( vNodesByLevel );
    return Counter;
}